

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_slice.c
# Opt level: O0

int infer_skip(bitstream *str,h264_slice *slice,h264_macroblock *mb)

{
  undefined4 uVar1;
  int iVar2;
  long in_RDX;
  long in_RSI;
  int i;
  int val;
  uint32_t skip_type;
  uint32_t in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffd8;
  int local_4;
  
  uVar1 = 0x20;
  if (*(int *)(in_RSI + 0x40) == 1) {
    uVar1 = 0x38;
  }
  if (*(int *)(in_RSI + 0xc28) == 0) {
    iVar2 = vs_infer((bitstream *)CONCAT44(uVar1,in_stack_ffffffffffffffd8),
                     (uint32_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffcc);
    if (iVar2 != 0) {
      return 1;
    }
  }
  else if ((*(uint *)(in_RSI + 0xc34) & 1) != 0) {
    iVar2 = h264_is_skip_mb_type
                      (*(uint32_t *)
                        (*(long *)(in_RSI + 0xc40) +
                         (ulong)(*(uint *)(in_RSI + 0xc34) & 0xfffffffe) * 0x3774 + 4));
    if (iVar2 != 0) {
      in_stack_ffffffffffffffd8 =
           inferred_mb_field_decoding_flag((h264_slice *)CONCAT44(uVar1,in_stack_ffffffffffffffd8));
      iVar2 = vs_infer((bitstream *)CONCAT44(uVar1,in_stack_ffffffffffffffd8),
                       (uint32_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffcc);
      if (iVar2 != 0) {
        return 1;
      }
    }
    iVar2 = vs_infer((bitstream *)CONCAT44(uVar1,in_stack_ffffffffffffffd8),
                     (uint32_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffcc);
    if (iVar2 != 0) {
      return 1;
    }
  }
  iVar2 = vs_infer((bitstream *)CONCAT44(uVar1,in_stack_ffffffffffffffd8),
                   (uint32_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffcc);
  if (iVar2 == 0) {
    iVar2 = vs_infers((bitstream *)CONCAT44(uVar1,in_stack_ffffffffffffffd8),
                      (int32_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      in_stack_ffffffffffffffcc);
    if (iVar2 == 0) {
      iVar2 = vs_infer((bitstream *)CONCAT44(uVar1,in_stack_ffffffffffffffd8),
                       (uint32_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffcc);
      if (iVar2 == 0) {
        iVar2 = vs_infer((bitstream *)CONCAT44(uVar1,in_stack_ffffffffffffffd8),
                         (uint32_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                         in_stack_ffffffffffffffcc);
        if (iVar2 == 0) {
          iVar2 = vs_infer((bitstream *)CONCAT44(uVar1,in_stack_ffffffffffffffd8),
                           (uint32_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
                           ,in_stack_ffffffffffffffcc);
          if (iVar2 == 0) {
            iVar2 = infer_intra((bitstream *)CONCAT44(uVar1,in_stack_ffffffffffffffd8),
                                (h264_macroblock *)
                                CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                                in_stack_ffffffffffffffcc);
            if (iVar2 == 0) {
              iVar2 = infer_intra((bitstream *)CONCAT44(uVar1,in_stack_ffffffffffffffd8),
                                  (h264_macroblock *)
                                  CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                                  in_stack_ffffffffffffffcc);
              if (iVar2 == 0) {
                for (iVar2 = 0; iVar2 < 0x11; iVar2 = iVar2 + 1) {
                  *(undefined4 *)(in_RDX + 0x36a8 + (long)iVar2 * 4) = 0;
                  *(undefined4 *)(in_RDX + 0x36ec + (long)iVar2 * 4) = 0;
                  *(undefined4 *)(in_RDX + 0x3730 + (long)iVar2 * 4) = 0;
                }
                for (iVar2 = 0; iVar2 < 0x10; iVar2 = iVar2 + 1) {
                  *(undefined4 *)(in_RDX + 0x35e8 + (long)iVar2 * 4) = 0;
                  *(undefined4 *)(in_RDX + 0x3628 + (long)iVar2 * 4) = 0;
                  *(undefined4 *)(in_RDX + 0x3668 + (long)iVar2 * 4) = 0;
                }
                local_4 = 0;
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int infer_skip(struct bitstream *str, struct h264_slice *slice, struct h264_macroblock *mb) {
	uint32_t skip_type = (slice->slice_type == H264_SLICE_TYPE_B ? H264_MB_TYPE_B_SKIP : H264_MB_TYPE_P_SKIP);
	if (slice->mbaff_frame_flag) {
		if (slice->curr_mb_addr & 1) {
			if (h264_is_skip_mb_type(slice->mbs[slice->curr_mb_addr & ~1].mb_type)) {
				int val = inferred_mb_field_decoding_flag(slice);
				if (vs_infer(str, &mb[-1].mb_field_decoding_flag, val)) return 1;
			}
			if (vs_infer(str, &mb->mb_field_decoding_flag, mb[-1].mb_field_decoding_flag)) return 1;
		}
	} else {
		if (vs_infer(str, &slice->mbs[slice->curr_mb_addr].mb_field_decoding_flag, slice->field_pic_flag)) return 1;

	}
	if (vs_infer(str, &mb->mb_type, skip_type)) return 1;
	if (vs_infers(str, &mb->mb_qp_delta, 0)) return 1;
	if (vs_infer(str, &mb->transform_size_8x8_flag, 0)) return 1;
	if (vs_infer(str, &mb->coded_block_pattern, 0)) return 1;
	if (vs_infer(str, &mb->intra_chroma_pred_mode, 0)) return 1;
	if (infer_intra(str, mb, 0)) return 1;
	if (infer_intra(str, mb, 1)) return 1;
	int i;
	for (i = 0; i < 17; i++) {
		mb->coded_block_flag[0][i] = 0;
		mb->coded_block_flag[1][i] = 0;
		mb->coded_block_flag[2][i] = 0;
	}
	for (i = 0; i < 16; i++) {
		mb->total_coeff[0][i] = 0;
		mb->total_coeff[1][i] = 0;
		mb->total_coeff[2][i] = 0;
	}
	return 0;
}